

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

int __thiscall
re2::PCRE::TryMatch(PCRE *this,StringPiece *text,int startpos,Anchor anchor,bool empty_ok,int *vec,
                   int vecsize)

{
  pcre *ppVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  char *local_6a0;
  pcre *local_678;
  LogMessage local_668;
  LogMessage local_4e8;
  LogMessage local_368;
  int local_1e8;
  int local_1e4;
  int rc;
  int options;
  pcre_extra extra;
  int stack_limit;
  int match_limit;
  LogMessage local_1c0;
  pcre *local_40;
  pcre *re;
  int *vec_local;
  Anchor local_28;
  int iStack_24;
  bool empty_ok_local;
  Anchor anchor_local;
  int startpos_local;
  StringPiece *text_local;
  PCRE *this_local;
  
  if (anchor == ANCHOR_BOTH) {
    local_678 = this->re_full_;
  }
  else {
    local_678 = this->re_partial_;
  }
  local_40 = local_678;
  re = (pcre *)vec;
  vec_local._7_1_ = empty_ok;
  local_28 = anchor;
  iStack_24 = startpos;
  _anchor_local = text;
  text_local = (StringPiece *)this;
  if (local_678 == (pcre *)0x0) {
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",0x1f7
               ,2);
    poVar3 = LogMessage::stream(&local_1c0);
    poVar3 = std::operator<<(poVar3,"Matching against invalid re: ");
    std::operator<<(poVar3,(string *)this->error_);
    LogMessage::~LogMessage(&local_1c0);
    this_local._4_4_ = 0;
  }
  else {
    extra.match_limit_recursion = this->match_limit_;
    if (extra.match_limit_recursion < 1) {
      extra.match_limit_recursion = FLAGS_regexp_match_limit;
    }
    extra.match_limit = this->stack_limit_;
    if (extra.match_limit < 1) {
      extra.match_limit = FLAGS_regexp_stack_limit;
    }
    memset(&rc,0,0xc);
    ppVar1 = local_40;
    if (0 < extra.match_limit_recursion) {
      options = extra.match_limit_recursion;
    }
    if (0 < extra.match_limit) {
      extra.flags = extra.match_limit / 700;
    }
    local_1e4 = 0;
    pcVar4 = StringPiece::data(_anchor_local);
    if (pcVar4 == (char *)0x0) {
      local_6a0 = "";
    }
    else {
      local_6a0 = StringPiece::data(_anchor_local);
    }
    iVar2 = StringPiece::size(_anchor_local);
    local_1e8 = pcre_exec(ppVar1,(pcre_extra *)&rc,local_6a0,iVar2,iStack_24,local_1e4,(int *)re,
                          vecsize);
    if (local_1e8 == 0) {
      local_1e8 = vecsize / 2;
    }
    else if (local_1e8 < 0) {
      if (local_1e8 == 1) {
        return 0;
      }
      if (local_1e8 != 2) {
        if (local_1e8 != 3) {
          LogMessage::LogMessage
                    (&local_668,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                     ,0x242,2);
          poVar3 = LogMessage::stream(&local_668);
          poVar3 = std::operator<<(poVar3,"Unexpected return code: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1e8);
          poVar3 = std::operator<<(poVar3," when matching \'");
          poVar3 = std::operator<<(poVar3,(string *)this);
          poVar3 = std::operator<<(poVar3,"\'");
          poVar3 = std::operator<<(poVar3,", re=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_40);
          poVar3 = std::operator<<(poVar3,", text=");
          poVar3 = operator<<(poVar3,_anchor_local);
          poVar3 = std::operator<<(poVar3,", vec=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,re);
          poVar3 = std::operator<<(poVar3,", vecsize=");
          std::ostream::operator<<(poVar3,vecsize);
          LogMessage::~LogMessage(&local_668);
          return 0;
        }
        this->hit_limit_ = 1;
        LogMessage::LogMessage
                  (&local_4e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                   0x235,1);
        poVar3 = LogMessage::stream(&local_4e8);
        poVar3 = std::operator<<(poVar3,"Exceeded stack limit of ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,extra.match_limit);
        poVar3 = std::operator<<(poVar3," when matching \'");
        poVar3 = std::operator<<(poVar3,(string *)this);
        poVar3 = std::operator<<(poVar3,"\'");
        poVar3 = std::operator<<(poVar3," against text that is ");
        iVar2 = StringPiece::size(_anchor_local);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        std::operator<<(poVar3," bytes.");
        LogMessage::~LogMessage(&local_4e8);
        return 0;
      }
      this->hit_limit_ = 1;
      LogMessage::LogMessage
                (&local_368,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                 0x22e,1);
      poVar3 = LogMessage::stream(&local_368);
      poVar3 = std::operator<<(poVar3,"Exceeded match limit of ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,extra.match_limit_recursion);
      poVar3 = std::operator<<(poVar3," when matching \'");
      poVar3 = std::operator<<(poVar3,(string *)this);
      poVar3 = std::operator<<(poVar3,"\'");
      poVar3 = std::operator<<(poVar3," against text that is ");
      iVar2 = StringPiece::size(_anchor_local);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::operator<<(poVar3," bytes.");
      LogMessage::~LogMessage(&local_368);
      return 0;
    }
    this_local._4_4_ = local_1e8;
  }
  return this_local._4_4_;
}

Assistant:

int PCRE::TryMatch(const StringPiece& text,
                 int startpos,
                 Anchor anchor,
                 bool empty_ok,
                 int *vec,
                 int vecsize) const {
  pcre* re = (anchor == ANCHOR_BOTH) ? re_full_ : re_partial_;
  if (re == NULL) {
    PCREPORT(ERROR) << "Matching against invalid re: " << *error_;
    return 0;
  }

  int match_limit = match_limit_;
  if (match_limit <= 0) {
    match_limit = FLAGS_regexp_match_limit;
  }

  int stack_limit = stack_limit_;
  if (stack_limit <= 0) {
    stack_limit = FLAGS_regexp_stack_limit;
  }

  pcre_extra extra = { 0 };
  if (match_limit > 0) {
    extra.flags |= PCRE_EXTRA_MATCH_LIMIT;
    extra.match_limit = match_limit;
  }
  if (stack_limit > 0) {
    extra.flags |= PCRE_EXTRA_MATCH_LIMIT_RECURSION;
    extra.match_limit_recursion = stack_limit / kPCREFrameSize;
  }

  int options = 0;
  if (anchor != UNANCHORED)
    options |= PCRE_ANCHORED;
  if (!empty_ok)
    options |= PCRE_NOTEMPTY;

  int rc = pcre_exec(re,              // The regular expression object
                     &extra,
                     (text.data() == NULL) ? "" : text.data(),
                     text.size(),
                     startpos,
                     options,
                     vec,
                     vecsize);

  // Handle errors
  if (rc == 0) {
    // pcre_exec() returns 0 as a special case when the number of
    // capturing subpatterns exceeds the size of the vector.
    // When this happens, there is a match and the output vector
    // is filled, but we miss out on the positions of the extra subpatterns.
    rc = vecsize / 2;
  } else if (rc < 0) {
    switch (rc) {
      case PCRE_ERROR_NOMATCH:
        return 0;
      case PCRE_ERROR_MATCHLIMIT:
        // Writing to hit_limit is not safe if multiple threads
        // are using the PCRE, but the flag is only intended
        // for use by unit tests anyway, so we let it go.
        hit_limit_ = true;
        PCREPORT(WARNING) << "Exceeded match limit of " << match_limit
                        << " when matching '" << pattern_ << "'"
                        << " against text that is " << text.size() << " bytes.";
        return 0;
      case PCRE_ERROR_RECURSIONLIMIT:
        // See comment about hit_limit above.
        hit_limit_ = true;
        PCREPORT(WARNING) << "Exceeded stack limit of " << stack_limit
                        << " when matching '" << pattern_ << "'"
                        << " against text that is " << text.size() << " bytes.";
        return 0;
      default:
        // There are other return codes from pcre.h :
        // PCRE_ERROR_NULL           (-2)
        // PCRE_ERROR_BADOPTION      (-3)
        // PCRE_ERROR_BADMAGIC       (-4)
        // PCRE_ERROR_UNKNOWN_NODE   (-5)
        // PCRE_ERROR_NOMEMORY       (-6)
        // PCRE_ERROR_NOSUBSTRING    (-7)
        // ...
        PCREPORT(ERROR) << "Unexpected return code: " << rc
                      << " when matching '" << pattern_ << "'"
                      << ", re=" << re
                      << ", text=" << text
                      << ", vec=" << vec
                      << ", vecsize=" << vecsize;
        return 0;
    }
  }

  return rc;
}